

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

int gold_detect(obj *sobj,boolean *scr_known)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  boolean bVar5;
  int iVar6;
  obj *poVar7;
  obj *poVar8;
  char *pcVar9;
  long lVar10;
  monst *pmVar11;
  uint material;
  ulong uVar12;
  byte bVar13;
  obj gold;
  obj local_138 [2];
  
  uVar3 = u._1052_1_;
  bVar13 = 0;
  material = (*(int *)&sobj->field_0x4a << 0x1e) >> 0x1f & 0xf;
  uVar12 = (ulong)material;
  bVar5 = clear_stale_map('\f',material);
  *scr_known = bVar5;
  for (pmVar11 = level->monlist; pmVar11 != (monst *)0x0; pmVar11 = pmVar11->nmon) {
    if (0 < pmVar11->mhp) {
      poVar7 = findgold(pmVar11->minvent);
      if ((poVar7 != (obj *)0x0) || (iVar6 = monsndx(pmVar11->data), iVar6 == 0x103)) {
LAB_0015fd28:
        *scr_known = '\x01';
        goto LAB_0015fd33;
      }
      poVar7 = (obj *)&pmVar11->minvent;
      while (poVar7 = poVar7->nobj, poVar7 != (obj *)0x0) {
        if (((sobj->field_0x4a & 2) != 0) &&
           (poVar8 = o_material(poVar7,(uint)uVar12), poVar8 != (obj *)0x0)) goto LAB_0015fd28;
        uVar12 = 0xc;
        poVar8 = o_in(poVar7,'\f');
        if (poVar8 != (obj *)0x0) goto LAB_0015fd28;
      }
    }
  }
  poVar7 = level->objlist;
  do {
    if (poVar7 == (obj *)0x0) {
      if (*scr_known == '\0') {
        if (youmonst.data == mons + 0x103) {
          pcVar9 = currency(2);
          sprintf((char *)local_138,"You feel like a million %s!",pcVar9);
        }
        else {
          lVar10 = hidden_gold();
          if ((lVar10 == 0) && (lVar10 = money_cnt(invent), lVar10 == 0)) {
            local_138[0].cobj._0_2_ = 0x6c6c;
            local_138[0].cobj._2_6_ = 0x726f6f702079;
            local_138[0].o_id._0_2_ = 0x2e;
            local_138[0].nobj = (obj *)0x6c65656620756f59;
            local_138[0].v._0_2_ = 0x6d20;
            local_138[0].v._2_6_ = 0x616972657461;
          }
          else {
            local_138[0].olev = (level *)0x6e616e6966206572;
            local_138[0]._40_8_ = 0x746973206c616963;
            local_138[0].cobj._0_2_ = 0x6120;
            local_138[0].cobj._2_6_ = 0x792074756f62;
            local_138[0].o_id._0_2_ = 0x756f;
            local_138[0]._26_6_ = 0x757475662072;
            local_138[0].nobj = (obj *)0x6c65656620756f59;
            local_138[0].v._0_2_ = 0x7720;
            local_138[0].v._2_6_ = 0x64656972726f;
            local_138[0].quan = 0x69746175;
            local_138[0].spe = 'o';
            local_138[0].oclass = 'n';
            local_138[0].invlet = '.';
            local_138[0].oartifact = '\0';
          }
        }
        strange_feeling(sobj,(char *)local_138);
        return 1;
      }
      if (bVar5 != '\0') {
        doredraw();
      }
      pcVar9 = body_part(5);
      pcVar9 = makeplural(pcVar9);
      pline("You notice some gold between your %s.",pcVar9);
      return 0;
    }
    if (((sobj->field_0x4a & 2) == 0) ||
       (poVar8 = o_material(poVar7,(uint)uVar12), poVar8 == (obj *)0x0)) {
      uVar12 = 0xc;
      poVar8 = o_in(poVar7,'\f');
      if (poVar8 != (obj *)0x0) goto LAB_0015ff1f;
    }
    else {
LAB_0015ff1f:
      *scr_known = '\x01';
      if ((poVar7->ox != u.ux) || (poVar7->oy != u.uy)) break;
    }
    poVar7 = poVar7->nobj;
  } while( true );
LAB_0015fd33:
  cls();
  u._1052_1_ = u._1052_1_ & 0xfd;
  poVar7 = level->objlist;
  do {
    if (poVar7 == (obj *)0x0) {
      pmVar11 = level->monlist;
      if (pmVar11 != (monst *)0x0) {
        do {
          if (0 < pmVar11->mhp) {
            poVar7 = findgold(pmVar11->minvent);
            if ((poVar7 == (obj *)0x0) && (iVar6 = monsndx(pmVar11->data), iVar6 != 0x103)) {
              poVar8 = (obj *)&pmVar11->minvent;
              do {
                poVar8 = poVar8->nobj;
                if (poVar8 == (obj *)0x0) goto LAB_0015fe13;
                if (((sobj->field_0x4a & 2) != 0) &&
                   (poVar7 = o_material(poVar8,(uint)uVar12), poVar7 != (obj *)0x0)) break;
                uVar12 = 0xc;
                poVar7 = o_in(poVar8,'\f');
              } while (poVar7 == (obj *)0x0);
              poVar7->ox = pmVar11->mx;
              poVar7->oy = pmVar11->my;
            }
            else {
              poVar7 = &zeroobj;
              poVar8 = local_138;
              for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
                poVar8->nobj = poVar7->nobj;
                poVar7 = (obj *)((long)poVar7 + ((ulong)bVar13 * -2 + 1) * 8);
                poVar8 = (obj *)((long)poVar8 + (ulong)bVar13 * -0x10 + 8);
              }
              local_138[0]._40_4_ = 0x1ef0000;
              uVar4 = local_138[0]._40_8_;
              uVar1 = pmVar11->mx;
              uVar2 = pmVar11->my;
              local_138[0].oy = uVar2;
              local_138[0].ox = uVar1;
              local_138[0]._42_6_ = SUB86(uVar4,2);
              poVar7 = local_138;
            }
            uVar12 = 1;
            map_object(poVar7,1);
          }
LAB_0015fe13:
          pmVar11 = pmVar11->nmon;
        } while (pmVar11 != (monst *)0x0);
      }
      newsym((int)u.ux,(int)u.uy);
      pline("You feel very greedy, and sense gold!");
      exercise(2,'\x01');
      (*windowprocs.win_pause)(P_MAP);
      doredraw();
      u._1052_1_ = u._1052_1_ & 0xfd | uVar3 & 2;
      if ((uVar3 & 2) != 0) {
        under_water(2);
      }
      if ((u._1052_1_ & 0x20) != 0) {
        under_ground(2);
      }
      return 0;
    }
    if (((sobj->field_0x4a & 2) == 0) ||
       (poVar8 = o_material(poVar7,(uint)uVar12), poVar8 == (obj *)0x0)) {
      uVar12 = 0xc;
      poVar8 = o_in(poVar7,'\f');
      if (poVar8 != (obj *)0x0) goto LAB_0015fd75;
    }
    else {
LAB_0015fd75:
      if (poVar8 != poVar7) {
        poVar8->ox = poVar7->ox;
        poVar8->oy = poVar7->oy;
      }
      uVar12 = 1;
      map_object(poVar8,1);
    }
    poVar7 = poVar7->nobj;
  } while( true );
}

Assistant:

int gold_detect(struct obj *sobj, boolean *scr_known)
{
    struct obj *obj;
    struct monst *mtmp;
    int uw = u.uinwater;
    struct obj *temp;
    boolean stale;

    *scr_known = stale = clear_stale_map(COIN_CLASS, sobj->blessed ? GOLD : 0);

    /* look for gold carried by monsters (might be in a container) */
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
    	if (DEADMONSTER(mtmp)) continue;	/* probably not needed in this case but... */
	if (findgold(mtmp->minvent) || monsndx(mtmp->data) == PM_GOLD_GOLEM) {
	    *scr_known = TRUE;
	    goto outgoldmap;	/* skip further searching */
	} else for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (sobj->blessed && o_material(obj, GOLD)) {
	    	*scr_known = TRUE;
	    	goto outgoldmap;
	    } else if (o_in(obj, COIN_CLASS)) {
		*scr_known = TRUE;
		goto outgoldmap;	/* skip further searching */
	    }
    }
    
    /* look for gold objects */
    for (obj = level->objlist; obj; obj = obj->nobj) {
	if (sobj->blessed && o_material(obj, GOLD)) {
	    *scr_known = TRUE;
	    if (obj->ox != u.ux || obj->oy != u.uy) goto outgoldmap;
	} else if (o_in(obj, COIN_CLASS)) {
	    *scr_known = TRUE;
	    if (obj->ox != u.ux || obj->oy != u.uy) goto outgoldmap;
	}
    }

    if (!*scr_known) {
	/* no gold found on floor or monster's inventory.
	   adjust message if you have gold in your inventory */
	char buf[BUFSZ];
	if (youmonst.data == &mons[PM_GOLD_GOLEM]) {
		sprintf(buf, "You feel like a million %s!", currency(2L));
	} else if (hidden_gold() || money_cnt(invent))
		strcpy(buf, "You feel worried about your future financial situation.");
	else
		strcpy(buf, "You feel materially poor.");
	strange_feeling(sobj, buf);
	return 1;
    }
    /* only under me - no separate display required */
    if (stale) doredraw();
    pline("You notice some gold between your %s.", makeplural(body_part(FOOT)));
    return 0;

outgoldmap:
    cls();

    u.uinwater = 0;
    /* Discover gold locations. */
    for (obj = level->objlist; obj; obj = obj->nobj) {
    	if (sobj->blessed && (temp = o_material(obj, GOLD))) {
	    if (temp != obj) {
		temp->ox = obj->ox;
		temp->oy = obj->oy;
	    }
	    map_object(temp,1);
	} else if ((temp = o_in(obj, COIN_CLASS))) {
	    if (temp != obj) {
		temp->ox = obj->ox;
		temp->oy = obj->oy;
	    }
	    map_object(temp,1);
	}
    }
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
    	if (DEADMONSTER(mtmp)) continue;	/* probably overkill here */
	if (findgold(mtmp->minvent) || monsndx(mtmp->data) == PM_GOLD_GOLEM) {
	    struct obj gold;
	    gold = zeroobj;
	    gold.otyp = GOLD_PIECE;
	    gold.ox = mtmp->mx;
	    gold.oy = mtmp->my;
	    map_object(&gold,1);
	} else for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (sobj->blessed && (temp = o_material(obj, GOLD))) {
		temp->ox = mtmp->mx;
		temp->oy = mtmp->my;
		map_object(temp,1);
		break;
	    } else if ((temp = o_in(obj, COIN_CLASS))) {
		temp->ox = mtmp->mx;
		temp->oy = mtmp->my;
		map_object(temp,1);
		break;
	    }
    }
    
    newsym(u.ux,u.uy);
    pline("You feel very greedy, and sense gold!");
    exercise(A_WIS, TRUE);
    win_pause_output(P_MAP);
    doredraw();
    u.uinwater = uw;
    if (Underwater) under_water(2);
    if (u.uburied) under_ground(2);
    return 0;
}